

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::crate::CrateReader::ReadStrings(CrateReader *this)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  ulong local_28;
  size_t i;
  Section *s;
  CrateReader *this_local;
  
  if ((this->_strings_index < 0) ||
     (lVar1 = this->_strings_index,
     sVar3 = ::std::vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>::
             size(&(this->_toc).sections), (long)sVar3 <= lVar1)) {
    ::std::__cxx11::string::operator+=
              ((string *)&this->_err,"Invalid index for `STRINGS` section.\n");
    return false;
  }
  pvVar4 = ::std::vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>::
           operator[](&(this->_toc).sections,this->_strings_index);
  if (pvVar4->size == 0) {
    return true;
  }
  bVar2 = StreamReader::seek_set(this->_sr,pvVar4->start);
  if (!bVar2) {
    ::std::__cxx11::string::operator+=
              ((string *)&this->_err,"Failed to move to `STRINGS` section.\n");
    return false;
  }
  bVar2 = ReadIndices(this,&this->_string_indices);
  if (!bVar2) {
    ::std::__cxx11::string::operator+=((string *)&this->_err,"Failed to read StringIndex array.\n");
    return false;
  }
  for (local_28 = 0;
      sVar3 = ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::size
                        (&this->_string_indices), local_28 < sVar3; local_28 = local_28 + 1) {
  }
  return true;
}

Assistant:

bool CrateReader::ReadStrings() {
  if ((_strings_index < 0) ||
      (_strings_index >= int64_t(_toc.sections.size()))) {
    _err += "Invalid index for `STRINGS` section.\n";
    return false;
  }

  const crate::Section &s = _toc.sections[size_t(_strings_index)];

  if (s.size == 0) {
    // empty `STRINGS`?
    return true;
  }

  if (!_sr->seek_set(uint64_t(s.start))) {
    _err += "Failed to move to `STRINGS` section.\n";
    return false;
  }

  // `STRINGS` are not compressed.
  if (!ReadIndices(&_string_indices)) {
    _err += "Failed to read StringIndex array.\n";
    return false;
  }

  for (size_t i = 0; i < _string_indices.size(); i++) {
    DCOUT("StringIndex[" << i << "] = " << _string_indices[i].value);
  }

  return true;
}